

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_decoding_transform.h
# Opt level: O2

bool __thiscall
draco::PredictionSchemeNormalOctahedronDecodingTransform<int>::DecodeTransformData
          (PredictionSchemeNormalOctahedronDecodingTransform<int> *this,DecoderBuffer *buffer)

{
  bool bVar1;
  int in_EAX;
  int max_quantized_value;
  int center_value;
  int local_18;
  int local_14;
  
  local_18 = in_EAX;
  bVar1 = DecoderBuffer::Decode<int>(buffer,&local_18);
  if (bVar1) {
    if (buffer->bitstream_version_ < 0x202) {
      bVar1 = DecoderBuffer::Decode<int>(buffer,&local_14);
      if (!bVar1) goto LAB_001580b0;
    }
    bVar1 = PredictionSchemeNormalOctahedronTransformBase<int>::set_max_quantized_value
                      (&this->super_PredictionSchemeNormalOctahedronTransformBase<int>,local_18);
  }
  else {
LAB_001580b0:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DecodeTransformData(DecoderBuffer *buffer) {
    DataTypeT max_quantized_value, center_value;
    if (!buffer->Decode(&max_quantized_value)) {
      return false;
    }
    if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
      if (!buffer->Decode(&center_value)) {
        return false;
      }
    }
    (void)center_value;
    return this->set_max_quantized_value(max_quantized_value);
  }